

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O0

void __thiscall
type_safe::detail::
copy_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>
::visitor::operator()(visitor *this,int *value,tagged_union<int,_double,_debugger_type> *dest)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<int> local_29;
  undefined8 local_28;
  type_id id;
  tagged_union<int,_double,_debugger_type> *dest_local;
  int *value_local;
  visitor *this_local;
  
  local_28 = 1;
  id.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            )(strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
              )dest;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(dest);
  bVar1 = strong_typedef_op::operator==
                    (lhs,(equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id>
                          *)&local_28);
  if (bVar1) {
    do_assign<int,void>(this,(tagged_union<int,_double,_debugger_type> *)
                             id.
                             super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                             .value_,value);
  }
  else {
    union_type<int>::union_type(&local_29);
    optional_variant_policy::change_value<int,int,double,debugger_type,int_const&>
              (id.
               super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
               .value_,value);
  }
  return;
}

Assistant:

void operator()(const T& value, Union& dest)
            {
                constexpr auto id = typename Union::type_id(union_type<T>{});
                if (dest.type() == id)
                    do_assign(dest, value);
                else
                    VariantPolicy::change_value(union_type<T>{}, dest, value);
            }